

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O0

void __thiscall
database::ComparableString::ComparableString(ComparableString *this,ComparableString *string)

{
  ComparableString *string_local;
  ComparableString *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)string);
  return;
}

Assistant:

ComparableString(const database::ComparableString& string) { this -> m_string = string.m_string; }